

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<13,_2,_13,_2,_13>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  long lVar2;
  int row;
  long lVar3;
  long lVar4;
  int row_1;
  undefined4 uVar5;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Mat4 m;
  Mat4 m_1;
  float afStack_150 [6];
  float local_138 [4];
  float local_128 [2];
  ulong local_120;
  undefined4 local_118;
  float local_110 [4];
  float local_100 [4];
  float local_f0 [6];
  Matrix<float,_4,_4> local_d8;
  Matrix<float,_4,_4> local_98;
  Matrix<float,_4,_4> local_58;
  
  pfVar1 = (float *)&local_d8;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar5 = 0;
      }
      *(undefined4 *)((long)pfVar1 + lVar4) = uVar5;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    lVar2 = lVar2 + 0x10;
  } while (lVar3 != 4);
  local_d8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  local_d8.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
  local_d8.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
  local_d8.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  local_d8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  local_d8.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  local_d8.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
  local_d8.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  pfVar1 = (float *)&local_58;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar5 = 0;
      }
      *(undefined4 *)((long)pfVar1 + lVar4) = uVar5;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    lVar2 = lVar2 + 0x10;
  } while (lVar3 != 4);
  local_58.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  local_58.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
  local_58.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
  local_58.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  local_58.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  local_58.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  local_58.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
  local_58.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  afStack_150[0] = 2.2104274e-38;
  afStack_150[1] = 0.0;
  tcu::operator*(&local_98,&local_d8,&local_58);
  local_f0[0] = local_98.m_data.m_data[0].m_data[0];
  local_f0[1] = local_98.m_data.m_data[0].m_data[1];
  local_f0[2] = local_98.m_data.m_data[0].m_data[2];
  local_100[0] = local_98.m_data.m_data[1].m_data[1];
  local_100[1] = local_98.m_data.m_data[1].m_data[2];
  local_100[2] = local_98.m_data.m_data[1].m_data[3];
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  lVar2 = 0;
  do {
    local_138[lVar2] = local_f0[lVar2] + local_100[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_110[0] = local_98.m_data.m_data[2].m_data[2];
  local_110[1] = local_98.m_data.m_data[2].m_data[3];
  local_110[2] = local_98.m_data.m_data[2].m_data[0];
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_120 = local_120 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    local_128[lVar2] = local_138[lVar2] + local_110[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_f0[3] = local_98.m_data.m_data[3].m_data[3];
  local_f0[4] = local_98.m_data.m_data[3].m_data[0];
  local_f0[5] = local_98.m_data.m_data[3].m_data[1];
  afStack_150[2] = 0.0;
  afStack_150[3] = 0.0;
  afStack_150[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_150[lVar2 + 2] = local_128[lVar2] + local_f0[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_120 = 0x100000000;
  local_118 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_128[lVar2]] = afStack_150[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}